

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

void __thiscall roaring::Roaring64Map::Roaring64Map(Roaring64Map *this,size_t n,uint64_t *data)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->roarings)._M_t._M_impl.super__Rb_tree_header;
  (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(undefined8 *)&(this->roarings)._M_t._M_impl = 0;
  *(undefined8 *)&(this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->copyOnWrite = false;
  addMany(this,n,data);
  return;
}

Assistant:

Roaring64Map(size_t n, const uint64_t *data) { addMany(n, data); }